

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

bool __thiscall
google::protobuf::internal::cpp::IsLazilyInitializedFile(cpp *this,string_view filename)

{
  int iVar1;
  size_type __rlen;
  void *__s1;
  bool bVar2;
  
  __s1 = (void *)filename._M_len;
  bVar2 = false;
  switch(this) {
  case (cpp *)0x20:
    break;
  case (cpp *)0x21:
switchD_00229152_caseD_21:
    iVar1 = bcmp(__s1,"net/proto2/proto/descriptor.proto",(size_t)this);
    if (iVar1 == 0) {
      return true;
    }
    if (this != (cpp *)0x20) {
      return false;
    }
    break;
  case (cpp *)0x22:
switchD_00229152_caseD_22:
    iVar1 = bcmp(__s1,"google/protobuf/cpp_features.proto",(size_t)this);
    if (iVar1 == 0) {
      return true;
    }
    if (this != (cpp *)0x20) {
      if (this != (cpp *)&DAT_00000021) {
        return false;
      }
      goto switchD_00229152_caseD_21;
    }
    break;
  default:
    goto switchD_00229152_caseD_23;
  case (cpp *)0x27:
    iVar1 = bcmp(__s1,"third_party/protobuf/cpp_features.proto",(size_t)this);
    if (iVar1 == 0) {
      return true;
    }
    if (this != (cpp *)0x20) {
      if (this != (cpp *)&DAT_00000021) {
        if (this != (cpp *)0x22) {
          return false;
        }
        goto switchD_00229152_caseD_22;
      }
      goto switchD_00229152_caseD_21;
    }
  }
  iVar1 = bcmp(__s1,"google/protobuf/descriptor.proto",(size_t)this);
  bVar2 = iVar1 == 0;
switchD_00229152_caseD_23:
  return bVar2;
}

Assistant:

bool IsLazilyInitializedFile(absl::string_view filename) {
  if (filename == "third_party/protobuf/cpp_features.proto" ||
      filename == "google/protobuf/cpp_features.proto") {
    return true;
  }
  return filename == "net/proto2/proto/descriptor.proto" ||
         filename == "google/protobuf/descriptor.proto";
}